

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O2

void av1_nonrd_pick_intra_mode
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_cost,BLOCK_SIZE bsize,
               PICK_MODE_CONTEXT *ctx)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO *left_mi;
  uint8_t *__src;
  uint8_t uVar6;
  int64_t iVar7;
  int64_t iVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  undefined7 in_register_00000009;
  ulong uVar14;
  int mode_index;
  long lVar15;
  AV1_COMMON *cm;
  long lVar16;
  int iVar17;
  bool bVar18;
  int local_110;
  int64_t local_100;
  long local_f8;
  int local_cc;
  undefined4 local_c8;
  undefined1 uStack_c5;
  undefined3 uStack_c4;
  RD_STATS local_a8;
  int64_t local_80;
  estimate_block_intra_args args;
  
  mbmi = *(x->e_mbd).mi;
  args.mode = '\0';
  args.skippable = 1;
  args.rdc = (RD_STATS *)0x0;
  args.best_sad = 0xffffffff;
  args.prune_mode_based_on_sad = false;
  args.prune_palette_sad = false;
  uVar14 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  bVar9 = ""[(x->txfm_search_params).tx_mode_search_type];
  if (""[uVar14] < ""[(x->txfm_search_params).tx_mode_search_type]) {
    bVar9 = ""[uVar14];
  }
  mbmi->tx_size = bVar9;
  if (((cpi->sf).rt_sf.prune_intra_mode_using_best_sad_so_far == true) &&
     (txsize_to_bsize[bVar9] == bsize)) {
    args.prune_mode_based_on_sad = true;
    args.prune_palette_sad = false;
  }
  left_mi = (x->e_mbd).left_mbmi;
  cm = (AV1_COMMON *)ctx;
  args.cpi = cpi;
  args.x = x;
  bVar10 = av1_above_block_mode((x->e_mbd).above_mbmi);
  bVar11 = av1_left_block_mode(left_mi);
  iVar2 = intra_mode_context[bVar10];
  iVar13 = intra_mode_context[bVar11];
  uVar3 = x->source_variance;
  iVar4 = (x->e_mbd).mi_row;
  iVar5 = (x->e_mbd).mi_col;
  local_a8.rate = 0x7fffffff;
  local_a8.zero_rate = 0;
  local_a8.dist = 0x7fffffffffffffff;
  local_a8.rdcost = 0x7fffffffffffffff;
  local_a8.sse = 0x7fffffffffffffff;
  local_a8.skip_txfm = '\0';
  init_mbmi_nonrd(mbmi,'\0',(char)cpi + -0x80,(char)iVar13 * '4',cm);
  mbmi->mv[0] = (int_mv)0x80008000;
  mbmi->mv[1] = (int_mv)0x80008000;
  local_110 = 0x7fffffff;
  uVar6 = '\0';
  local_f8 = 0x7fffffffffffffff;
  local_80 = 0x7fffffffffffffff;
  local_100 = 0x7fffffffffffffff;
  local_cc = 0;
  bVar9 = 0;
  for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
    bVar1 = ""[lVar15];
    if ((((lVar15 == 0) || (bsize < BLOCK_32X32)) || (x->source_variance != 0)) ||
       ((iVar5 != 0 || (iVar4 != 0)))) {
      if ((lVar15 == 2 & (cpi->sf).rt_sf.prune_h_pred_using_best_mode_so_far & bVar9 == 1) == 0) {
        if (((lVar15 == 0) || ((cpi->sf).rt_sf.enable_intra_mode_pruning_using_neighbors == false))
           || ((bVar1 == bVar10 ||
               ((((x->e_mbd).up_available == false || (bVar1 == bVar11)) ||
                ((x->e_mbd).left_available == false)))))) {
LAB_00202273:
          local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
          local_a8.dist = 0;
          args.skippable = 1;
          args.rdc = &local_a8;
          mbmi->mode = bVar1;
          args.mode = bVar1;
          av1_foreach_transformed_block_in_plane(&x->e_mbd,bsize,0,av1_estimate_block_intra,&args);
          iVar17 = local_a8.rate;
          if (local_a8.rate != 0x7fffffff) {
            uVar12 = av1_get_skip_txfm_context(&x->e_mbd);
            iVar7 = local_a8.dist;
            if (args.skippable == 0) {
              iVar17 = iVar17 + (x->mode_costs).skip_txfm_cost[uVar12][0];
            }
            else {
              iVar17 = (x->mode_costs).skip_txfm_cost[uVar12][1];
            }
            lVar16 = (long)iVar17 + (long)(x->mode_costs).y_mode_costs[iVar2][iVar13][bVar1];
            iVar17 = (int)lVar16;
            local_a8.rate = iVar17;
            lVar16 = local_a8.dist * 0x80 + (x->rdmult * lVar16 + 0x100 >> 9);
            local_a8.rdcost = lVar16;
            if (lVar16 < local_f8) {
              local_cc = local_a8.zero_rate;
              local_80 = local_a8.sse;
              local_c8 = local_a8._33_4_;
              uStack_c4 = local_a8._37_3_;
              uVar6 = local_a8.skip_txfm;
              if (local_a8.skip_txfm == '\0') {
                uVar6 = '\0';
                memset(ctx->blk_skip,0,(long)ctx->num_4x4_blk);
              }
              local_100 = iVar7;
              bVar9 = bVar1;
              local_110 = iVar17;
              local_f8 = lVar16;
            }
          }
        }
        else if ((lVar15 == 3) || (0x32 < uVar3)) {
          if (lVar15 != 3 || bVar9 != 0) goto LAB_00202273;
          bVar9 = 0;
        }
      }
      else {
        bVar9 = 1;
      }
    }
  }
  iVar2 = (cpi->sf).rt_sf.prune_palette_search_nonrd;
  uVar3 = 0x14;
  if (1 < iVar2) {
    uVar3 = 100;
  }
  uVar12 = args.best_sad >> (""[uVar14] + ""[uVar14] & 0x1f);
  if ((cpi->oxcf).tool_cfg.enable_palette == false) {
    if (iVar2 < 1) goto LAB_002025af;
    bVar18 = false;
LAB_0020249c:
    if (args.prune_mode_based_on_sad == true) {
      if ((BLOCK_16X16 < bsize) || (uVar12 <= uVar3)) goto LAB_002025af;
    }
    else if (BLOCK_16X16 < bsize) goto LAB_002025af;
    if (!(bool)(bVar18 & 200 < x->source_variance)) goto LAB_002025af;
  }
  else {
    iVar13 = av1_allow_palette((uint)(cpi->common).features.allow_screen_content_tools,mbmi->bsize);
    bVar18 = iVar13 != 0;
    if (0 < iVar2) goto LAB_0020249c;
    if (iVar13 == 0) goto LAB_002025af;
  }
  x->color_palette_thresh = (uint)(499 < uVar12) * 0x20 + 0x20;
  av1_search_palette_mode_luma(cpi,x,bsize,0,ctx,&local_a8,local_f8);
  iVar8 = local_a8.rdcost;
  iVar7 = local_a8.dist;
  if (local_a8.rdcost < local_f8) {
    mbmi->mv[0] = (int_mv)0x80008000;
    mbmi->mv[1] = (int_mv)0x80008000;
    local_110 = local_a8.rate;
    if (local_a8.skip_txfm == '\0') {
      memcpy(ctx->blk_skip,(x->txfm_search_info).blk_skip,(long)ctx->num_4x4_blk);
    }
    __src = (x->e_mbd).tx_type_map;
    if (*__src != '\0') {
      memcpy(ctx->tx_type_map,__src,(long)ctx->num_4x4_blk);
    }
    bVar9 = 0;
    local_f8 = iVar8;
    local_100 = iVar7;
  }
  else {
    (mbmi->palette_mode_info).palette_colors[0x10] = 0;
    (mbmi->palette_mode_info).palette_colors[0x11] = 0;
    (mbmi->palette_mode_info).palette_colors[0x12] = 0;
    (mbmi->palette_mode_info).palette_colors[0x13] = 0;
    (mbmi->palette_mode_info).palette_colors[0x14] = 0;
    (mbmi->palette_mode_info).palette_colors[0x15] = 0;
    (mbmi->palette_mode_info).palette_colors[0x16] = 0;
    (mbmi->palette_mode_info).palette_colors[0x17] = 0;
    (mbmi->palette_mode_info).palette_colors[8] = 0;
    (mbmi->palette_mode_info).palette_colors[9] = 0;
    (mbmi->palette_mode_info).palette_colors[10] = 0;
    (mbmi->palette_mode_info).palette_colors[0xb] = 0;
    (mbmi->palette_mode_info).palette_colors[0xc] = 0;
    (mbmi->palette_mode_info).palette_colors[0xd] = 0;
    (mbmi->palette_mode_info).palette_colors[0xe] = 0;
    (mbmi->palette_mode_info).palette_colors[0xf] = 0;
    (mbmi->palette_mode_info).palette_colors[0] = 0;
    (mbmi->palette_mode_info).palette_colors[1] = 0;
    (mbmi->palette_mode_info).palette_colors[2] = 0;
    (mbmi->palette_mode_info).palette_colors[3] = 0;
    (mbmi->palette_mode_info).palette_colors[4] = 0;
    (mbmi->palette_mode_info).palette_colors[5] = 0;
    (mbmi->palette_mode_info).palette_colors[6] = 0;
    (mbmi->palette_mode_info).palette_colors[7] = 0;
    (mbmi->palette_mode_info).palette_size[0] = '\0';
    (mbmi->palette_mode_info).palette_size[1] = '\0';
  }
LAB_002025af:
  mbmi->mode = bVar9;
  mbmi->uv_mode = '\0';
  rd_cost->rate = local_110;
  rd_cost->zero_rate = local_cc;
  rd_cost->dist = local_100;
  rd_cost->rdcost = local_f8;
  rd_cost->sse = local_80;
  rd_cost->skip_txfm = uVar6;
  *(uint *)&rd_cost->field_0x24 = CONCAT31(uStack_c4,uStack_c5);
  *(undefined4 *)&rd_cost->field_0x21 = local_c8;
  if (((cpi->oxcf).rc_cfg.best_allowed_q == 0) && ((cpi->oxcf).rc_cfg.worst_allowed_q == 0)) {
    (x->txfm_search_info).skip_txfm = '\0';
    memset(ctx->blk_skip,0,(long)ctx->num_4x4_blk);
  }
  store_coding_context_nonrd(x,ctx);
  return;
}

Assistant:

void av1_nonrd_pick_intra_mode(AV1_COMP *cpi, MACROBLOCK *x, RD_STATS *rd_cost,
                               BLOCK_SIZE bsize, PICK_MODE_CONTEXT *ctx) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mi = xd->mi[0];
  RD_STATS this_rdc, best_rdc;
  struct estimate_block_intra_args args;
  init_estimate_block_intra_args(&args, cpi, x);
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  mi->tx_size =
      AOMMIN(max_txsize_lookup[bsize],
             tx_mode_to_biggest_tx_size[txfm_params->tx_mode_search_type]);
  assert(IMPLIES(xd->lossless[mi->segment_id], mi->tx_size == TX_4X4));
  const BLOCK_SIZE tx_bsize = txsize_to_bsize[mi->tx_size];

  // If the current block size is the same as the transform block size, enable
  // mode pruning based on the best SAD so far.
  if (cpi->sf.rt_sf.prune_intra_mode_using_best_sad_so_far && bsize == tx_bsize)
    args.prune_mode_based_on_sad = true;

  int *bmode_costs;
  PREDICTION_MODE best_mode = DC_PRED;
  const MB_MODE_INFO *above_mi = xd->above_mbmi;
  const MB_MODE_INFO *left_mi = xd->left_mbmi;
  const PREDICTION_MODE A = av1_above_block_mode(above_mi);
  const PREDICTION_MODE L = av1_left_block_mode(left_mi);
  const int above_ctx = intra_mode_context[A];
  const int left_ctx = intra_mode_context[L];
  const unsigned int source_variance = x->source_variance;
  bmode_costs = x->mode_costs.y_mode_costs[above_ctx][left_ctx];
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  av1_invalid_rd_stats(&best_rdc);
  av1_invalid_rd_stats(&this_rdc);

  init_mbmi_nonrd(mi, DC_PRED, INTRA_FRAME, NONE_FRAME, cm);
  mi->mv[0].as_int = mi->mv[1].as_int = INVALID_MV;

  // Change the limit of this loop to add other intra prediction
  // mode tests.
  for (int mode_index = 0; mode_index < RTC_INTRA_MODES; ++mode_index) {
    PREDICTION_MODE this_mode = intra_mode_list[mode_index];

    // Force DC for spatially flat block for large bsize, on top-left corner.
    // This removed potential artifact observed in gray scale image for high Q.
    if (x->source_variance == 0 && mi_col == 0 && mi_row == 0 &&
        bsize >= BLOCK_32X32 && this_mode > 0)
      continue;

    // As per the statistics generated for intra mode evaluation in the nonrd
    // path, it is found that the probability of H_PRED mode being the winner is
    // very low when the best mode so far is V_PRED (out of DC_PRED and V_PRED).
    // If V_PRED is the winner mode out of DC_PRED and V_PRED, it could imply
    // the presence of a vertically dominant pattern. Hence, H_PRED mode is not
    // evaluated.
    if (cpi->sf.rt_sf.prune_h_pred_using_best_mode_so_far &&
        this_mode == H_PRED && best_mode == V_PRED)
      continue;

    if (should_prune_intra_modes_using_neighbors(
            xd, cpi->sf.rt_sf.enable_intra_mode_pruning_using_neighbors,
            this_mode, A, L)) {
      // Prune V_PRED and H_PRED if source variance of the block is less than
      // or equal to 50. The source variance threshold is obtained empirically.
      if ((this_mode == V_PRED || this_mode == H_PRED) && source_variance <= 50)
        continue;

      // As per the statistics, probability of SMOOTH_PRED being the winner is
      // low when best mode so far is DC_PRED (out of DC_PRED, V_PRED and
      // H_PRED). Hence, SMOOTH_PRED mode is not evaluated.
      if (best_mode == DC_PRED && this_mode == SMOOTH_PRED) continue;
    }

    this_rdc.dist = this_rdc.rate = 0;
    args.mode = this_mode;
    args.skippable = 1;
    args.rdc = &this_rdc;
    mi->mode = this_mode;
    av1_foreach_transformed_block_in_plane(xd, bsize, AOM_PLANE_Y,
                                           av1_estimate_block_intra, &args);

    if (this_rdc.rate == INT_MAX) continue;

    const int skip_ctx = av1_get_skip_txfm_context(xd);
    if (args.skippable) {
      this_rdc.rate = x->mode_costs.skip_txfm_cost[skip_ctx][1];
    } else {
      this_rdc.rate += x->mode_costs.skip_txfm_cost[skip_ctx][0];
    }
    this_rdc.rate += bmode_costs[this_mode];
    this_rdc.rdcost = RDCOST(x->rdmult, this_rdc.rate, this_rdc.dist);

    if (this_rdc.rdcost < best_rdc.rdcost) {
      best_rdc = this_rdc;
      best_mode = this_mode;
      if (!this_rdc.skip_txfm) {
        memset(ctx->blk_skip, 0,
               sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
      }
    }
  }

  const unsigned int thresh_sad =
      cpi->sf.rt_sf.prune_palette_search_nonrd > 1 ? 100 : 20;
  const unsigned int best_sad_norm =
      args.best_sad >>
      (b_width_log2_lookup[bsize] + b_height_log2_lookup[bsize]);

  // Try palette if it's enabled.
  bool try_palette =
      cpi->oxcf.tool_cfg.enable_palette &&
      av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                        mi->bsize);
  if (cpi->sf.rt_sf.prune_palette_search_nonrd > 0) {
    bool prune =
        (!args.prune_mode_based_on_sad || best_sad_norm > thresh_sad) &&
        bsize <= BLOCK_16X16 && x->source_variance > 200;
    try_palette &= prune;
  }
  if (try_palette) {
    const TxfmSearchInfo *txfm_info = &x->txfm_search_info;
    const unsigned int intra_ref_frame_cost = 0;
    x->color_palette_thresh = (best_sad_norm < 500) ? 32 : 64;

    // Search palette mode for Luma plane in intra frame.
    av1_search_palette_mode_luma(cpi, x, bsize, intra_ref_frame_cost, ctx,
                                 &this_rdc, best_rdc.rdcost);
    // Update best mode data.
    if (this_rdc.rdcost < best_rdc.rdcost) {
      best_mode = DC_PRED;
      mi->mv[0].as_int = INVALID_MV;
      mi->mv[1].as_int = INVALID_MV;
      best_rdc.rate = this_rdc.rate;
      best_rdc.dist = this_rdc.dist;
      best_rdc.rdcost = this_rdc.rdcost;
      if (!this_rdc.skip_txfm) {
        memcpy(ctx->blk_skip, txfm_info->blk_skip,
               sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);
      }
      if (xd->tx_type_map[0] != DCT_DCT)
        av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
    } else {
      av1_zero(mi->palette_mode_info);
    }
  }

  mi->mode = best_mode;
  // Keep DC for UV since mode test is based on Y channel only.
  mi->uv_mode = UV_DC_PRED;
  *rd_cost = best_rdc;

  // For lossless: always force the skip flags off.
  // Even though the blk_skip is set to 0 above in the rdcost comparison,
  // do it here again in case the above logic changes.
  if (is_lossless_requested(&cpi->oxcf.rc_cfg)) {
    x->txfm_search_info.skip_txfm = 0;
    memset(ctx->blk_skip, 0,
           sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
  }

#if CONFIG_INTERNAL_STATS
  store_coding_context_nonrd(x, ctx, mi->mode);
#else
  store_coding_context_nonrd(x, ctx);
#endif  // CONFIG_INTERNAL_STATS
}